

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::AdjustFloorClip(AActor *this)

{
  double *pdVar1;
  double dVar2;
  msecnode_t *pmVar3;
  player_t *ppVar4;
  int iVar5;
  sector_t_conflict *psVar6;
  msecnode_t **ppmVar7;
  double dVar8;
  double dVar9;
  DVector3 pos;
  double local_78;
  DVector2 local_58;
  DVector3 local_48;
  
  if (((this->flags3).Value & 0x20) == 0) {
    dVar9 = this->Floorclip;
    if (((this->Sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) &&
       (dVar2 = (this->__Pos).Z, dVar8 = secplane_t::ZatPoint(&this->Sector->floorplane,this),
       dVar8 < dVar2)) {
      this->Floorclip = 0.0;
    }
    local_78 = 2147483647.0;
    ppmVar7 = &this->touching_sectorlist;
    while (pmVar3 = *ppmVar7, pmVar3 != (msecnode_t *)0x0) {
      PosRelative(&local_48,this,(sector_t *)pmVar3->m_sector);
      psVar6 = sector_t::GetHeightSec(pmVar3->m_sector);
      dVar2 = local_78;
      if (psVar6 == (sector_t_conflict *)0x0) {
        local_58.X = local_48.X;
        local_58.Y = local_48.Y;
        dVar8 = secplane_t::ZatPoint(&pmVar3->m_sector->floorplane,&local_58);
        pdVar1 = &(this->__Pos).Z;
        if ((dVar8 == *pdVar1) && (!NAN(dVar8) && !NAN(*pdVar1))) {
          iVar5 = sector_t::GetTerrain((sector_t *)pmVar3->m_sector,0);
          dVar2 = Terrains.Array[iVar5].FootClip;
          if (local_78 <= Terrains.Array[iVar5].FootClip) {
            dVar2 = local_78;
          }
        }
      }
      local_78 = dVar2;
      ppmVar7 = &pmVar3->m_tnext;
    }
    local_78 = (double)(~-(ulong)(local_78 == 2147483647.0) & (ulong)local_78);
    this->Floorclip = local_78;
    ppVar4 = this->player;
    if ((ppVar4 != (player_t *)0x0) && (ppVar4->mo == (APlayerPawn *)this)) {
      if ((dVar9 != local_78) || (NAN(dVar9) || NAN(local_78))) {
        dVar9 = ppVar4->viewheight - (dVar9 - local_78);
        ppVar4->viewheight = dVar9;
        ppVar4->deltaviewheight =
             ((ppVar4->mo->ViewHeight + ppVar4->crouchviewdelta) - dVar9) * 0.125;
      }
    }
  }
  return;
}

Assistant:

void AActor::AdjustFloorClip ()
{
	if (flags3 & MF3_SPECIALFLOORCLIP)
	{
		return;
	}

	double oldclip = Floorclip;
	double shallowestclip = INT_MAX;
	const msecnode_t *m;

	// possibly standing on a 3D-floor
	if (Sector->e->XFloor.ffloors.Size() && Z() > Sector->floorplane.ZatPoint(this)) Floorclip = 0;

	// [RH] clip based on shallowest floor player is standing on
	// If the sector has a deep water effect, then let that effect
	// do the floorclipping instead of the terrain type.
	for (m = touching_sectorlist; m; m = m->m_tnext)
	{
		DVector3 pos = PosRelative(m->m_sector);
		sector_t *hsec = m->m_sector->GetHeightSec();
		if (hsec == NULL && m->m_sector->floorplane.ZatPoint (pos) == Z())
		{
			double clip = Terrains[m->m_sector->GetTerrain(sector_t::floor)].FootClip;
			if (clip < shallowestclip)
			{
				shallowestclip = clip;
			}
		}
	}
	if (shallowestclip == INT_MAX)
	{
		Floorclip = 0;
	}
	else
	{
		Floorclip = shallowestclip;
	}
	if (player && player->mo == this && oldclip != Floorclip)
	{
		player->viewheight -= (oldclip - Floorclip);
		player->deltaviewheight = player->GetDeltaViewHeight();
	}
}